

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_array_container_lazy_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  array_container_t *out;
  bitset_container_t *pbVar1;
  _Bool _Var2;
  int size;
  bitset_container_t *ourbitset;
  
  size = src_2->cardinality + src_1->cardinality;
  if (size < 0x401) {
    out = array_container_create_given_capacity(size);
    *dst = out;
    if (out == (array_container_t *)0x0) {
      _Var2 = true;
    }
    else {
      array_container_union(src_1,src_2,out);
      _Var2 = false;
    }
  }
  else {
    pbVar1 = bitset_container_create();
    *dst = pbVar1;
    _Var2 = true;
    if (pbVar1 != (bitset_container_t *)0x0) {
      bitset_set_list(pbVar1->words,src_1->array,(long)src_1->cardinality);
      bitset_set_list(pbVar1->words,src_2->array,(long)src_2->cardinality);
      pbVar1->cardinality = -1;
    }
  }
  return _Var2;
}

Assistant:

bool array_array_container_lazy_union(const array_container_t *src_1,
                                      const array_container_t *src_2,
                                      container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    //
    // We assume that operations involving bitset containers will be faster than
    // operations involving solely array containers, except maybe when array
    // containers are small. Indeed, for example, it is cheap to compute the
    // union between an array and a bitset container, generally more so than
    // between a large array and another array. So it is advantageous to favour
    // bitset containers during the computation. Of course, if we convert array
    // containers eagerly to bitset containers, we may later need to revert the
    // bitset containers to array containerr to satisfy the Roaring format
    // requirements, but such one-time conversions at the end may not be overly
    // expensive. We arrived to this design based on extensive benchmarking.
    //
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) {
            array_container_union(src_1, src_2, CAST_array(*dst));
        } else {
            return true;  // otherwise failure won't be caught
        }
        return false;  // not a bitset
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}